

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

Tim_Man_t * Tim_ManStart(int nCis,int nCos)

{
  Tim_Man_t *__s;
  Mem_Flex_t *pMVar1;
  Tim_Obj_t *pTVar2;
  bool bVar3;
  int local_24;
  Tim_Obj_t *pTStack_20;
  int i;
  Tim_Obj_t *pObj;
  Tim_Man_t *p;
  int nCos_local;
  int nCis_local;
  
  __s = (Tim_Man_t *)malloc(0x38);
  memset(__s,0,0x38);
  pMVar1 = Mem_FlexStart();
  __s->pMemObj = pMVar1;
  __s->nCis = nCis;
  __s->nCos = nCos;
  pTVar2 = (Tim_Obj_t *)malloc((long)nCis * 0x18);
  __s->pCis = pTVar2;
  memset(__s->pCis,0,(long)nCis * 0x18);
  pTVar2 = (Tim_Obj_t *)malloc((long)nCos * 0x18);
  __s->pCos = pTVar2;
  memset(__s->pCos,0,(long)nCos * 0x18);
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < __s->nCis) {
      pTStack_20 = __s->pCis + local_24;
      bVar3 = pTStack_20 != (Tim_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pTStack_20->Id = local_24;
    pTStack_20->iObj2Num = -1;
    pTStack_20->iObj2Box = -1;
    pTStack_20->timeReq = 1e+09;
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < __s->nCos) {
      pTStack_20 = __s->pCos + local_24;
      bVar3 = pTStack_20 != (Tim_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pTStack_20->Id = local_24;
    pTStack_20->iObj2Num = -1;
    pTStack_20->iObj2Box = -1;
    pTStack_20->timeReq = 1e+09;
    local_24 = local_24 + 1;
  }
  __s->fUseTravId = 1;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the timing manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Tim_Man_t * Tim_ManStart( int nCis, int nCos )
{
    Tim_Man_t * p;
    Tim_Obj_t * pObj;
    int i;
    p = ABC_ALLOC( Tim_Man_t, 1 );
    memset( p, 0, sizeof(Tim_Man_t) );
    p->pMemObj = Mem_FlexStart();
    p->nCis = nCis;
    p->nCos = nCos;
    p->pCis = ABC_ALLOC( Tim_Obj_t, nCis );
    memset( p->pCis, 0, sizeof(Tim_Obj_t) * nCis );
    p->pCos = ABC_ALLOC( Tim_Obj_t, nCos );
    memset( p->pCos, 0, sizeof(Tim_Obj_t) * nCos );
    Tim_ManForEachCi( p, pObj, i )
    {
        pObj->Id = i;
        pObj->iObj2Box = pObj->iObj2Num = -1;
        pObj->timeReq = TIM_ETERNITY;
    }
    Tim_ManForEachCo( p, pObj, i )
    {
        pObj->Id = i;
        pObj->iObj2Box = pObj->iObj2Num = -1;
        pObj->timeReq = TIM_ETERNITY;
    }
    p->fUseTravId = 1;
    return p;
}